

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevc.cpp
# Opt level: O2

int __thiscall HevcSpsUnit::short_term_ref_pic_set(HevcSpsUnit *this,uint stRpsIdx)

{
  BitStreamReader *this_00;
  bool bVar1;
  uint uVar2;
  pointer puVar3;
  uint uVar4;
  uint j;
  uint uVar5;
  uint uVar6;
  
  if (stRpsIdx != 0) {
    this_00 = &(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader;
    bVar1 = BitStreamReader::getBit(this_00);
    if (bVar1) {
      uVar5 = stRpsIdx - 1;
      if (this->num_short_term_ref_pic_sets == stRpsIdx) {
        uVar2 = HevcUnit::extractUEGolombCode((HevcUnit *)this);
        if (stRpsIdx <= uVar2) {
          return 1;
        }
        uVar5 = uVar5 - uVar2;
      }
      BitStreamReader::skipBit(this_00);
      HevcUnit::extractUEGolombCode((HevcUnit *)this);
      uVar2 = 0;
      for (uVar6 = 0;
          puVar3 = (this->num_delta_pocs).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start, uVar6 <= puVar3[uVar5]; uVar6 = uVar6 + 1) {
        bVar1 = BitStreamReader::getBit(this_00);
        uVar4 = 1;
        if (!bVar1) {
          bVar1 = BitStreamReader::getBit(this_00);
          uVar4 = (uint)bVar1;
        }
        uVar2 = uVar2 + uVar4;
      }
      goto LAB_0019db57;
    }
  }
  uVar5 = HevcUnit::extractUEGolombCode((HevcUnit *)this);
  uVar2 = HevcUnit::extractUEGolombCode((HevcUnit *)this);
  uVar2 = uVar2 + uVar5;
  if (0x40 < uVar2) {
    return 1;
  }
  uVar5 = uVar2;
  while (bVar1 = uVar5 != 0, uVar5 = uVar5 - 1, bVar1) {
    uVar6 = HevcUnit::extractUEGolombCode((HevcUnit *)this);
    if (0x7fff < uVar6) {
      return 1;
    }
    BitStreamReader::skipBit(&(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader);
  }
  puVar3 = (this->num_delta_pocs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
LAB_0019db57:
  puVar3[stRpsIdx] = uVar2;
  return 0;
}

Assistant:

int HevcSpsUnit::short_term_ref_pic_set(const unsigned stRpsIdx)
{
    unsigned numDeltaPocs = 0;
    const bool inter_ref_pic_set_prediction_flag = stRpsIdx && m_reader.getBit();

    if (inter_ref_pic_set_prediction_flag)
    {
        unsigned refRpsIdx = stRpsIdx - 1;

        if (stRpsIdx == num_short_term_ref_pic_sets)
        {
            const unsigned delta_idx_minus1 = extractUEGolombCode();
            if (delta_idx_minus1 >= stRpsIdx)
                return 1;
            refRpsIdx -= delta_idx_minus1;
        }

        m_reader.skipBit();     // delta_rps_sign
        extractUEGolombCode();  // abs_delta_rps_minus1

        for (unsigned j = 0; j <= num_delta_pocs[refRpsIdx]; j++)
        {
            const bool used = m_reader.getBit();                          // used_by_curr_pic_flag[j]
            const bool use_delta_flag = used ? true : m_reader.getBit();  // use_delta_flag[j]
            if (use_delta_flag)
                numDeltaPocs++;
        }
    }
    else
    {
        // numDeltaPocs = num_negative_pics + num_positive_pics
        numDeltaPocs = extractUEGolombCode() + extractUEGolombCode();
        if (numDeltaPocs > 64)
            return 1;

        for (unsigned i = 0; i < numDeltaPocs; i++)
        {
            if (extractUEGolombCode() >= 0x8000)  // delta_poc_minus1[i]
                return 1;
            m_reader.skipBit();  // used_by_curr_pic_flag[i]
        }
    }
    num_delta_pocs[stRpsIdx] = numDeltaPocs;

    return 0;
}